

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
dgrminer::find_minimum_labelings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pattern_edge_list,
          vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *starting_edges,
          bool ignore_starting_edges)

{
  pointer paVar1;
  int iVar2;
  int iVar3;
  pointer paVar4;
  ulong uVar5;
  pointer paVar6;
  undefined7 in_register_00000009;
  long lVar7;
  ulong uVar8;
  iterator iVar9;
  int *piVar10;
  ulong uVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  array<int,_10UL> min_edge;
  int local_70;
  undefined4 local_6c;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_68;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,ignore_starting_edges);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar6 = (pattern_edge_list->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((pattern_edge_list->
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != paVar6) {
    lVar14 = 0xc;
    lVar13 = 0;
    uVar8 = 0;
    local_68 = pattern_edge_list;
    local_60 = starting_edges;
    do {
      if ((char)local_6c == '\0') {
        paVar4 = (local_60->
                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)(local_60->
                      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)paVar4;
        if (lVar7 != 0) {
          piVar10 = paVar4->_M_elems + 1;
          uVar11 = 0;
          bVar12 = false;
          do {
            bVar16 = true;
            if (paVar6[uVar8]._M_elems[2] == paVar4[uVar11]._M_elems[0]) {
              uVar5 = 0;
              do {
                uVar15 = uVar5;
                if (uVar15 == 6) {
                  bVar12 = true;
                  break;
                }
                uVar5 = uVar15 + 1;
              } while (*(int *)((long)paVar6->_M_elems + uVar15 * 4 + lVar14) == piVar10[uVar15]);
              bVar16 = uVar15 < 6;
            }
            if (!bVar16) break;
            uVar11 = uVar11 + 1;
            piVar10 = piVar10 + 8;
          } while (uVar11 < (ulong)(lVar7 >> 5));
          if (bVar12) goto LAB_00154bea;
        }
      }
      else {
LAB_00154bea:
        piVar10 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar9._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_70 = (int)uVar8;
        if (iVar9._M_current == piVar10) {
          if (iVar9._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,iVar9,&local_70);
          }
          else {
            *iVar9._M_current = local_70;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
          paVar6 = (local_68->
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_38 = *(undefined8 *)(paVar6[uVar8]._M_elems + 8);
          local_58 = *(undefined8 *)paVar6[uVar8]._M_elems;
          local_48 = *(undefined8 *)(paVar6[uVar8]._M_elems + 4);
          uStack_40 = *(undefined8 *)(paVar6[uVar8]._M_elems + 4 + 2);
          uStack_50 = *(undefined8 *)(paVar6[uVar8]._M_elems + 2);
        }
        else {
          paVar1 = paVar6 + uVar8;
          lVar7 = 2;
          do {
            iVar2 = *(int *)((long)&local_58 + lVar7 * 4);
            iVar3 = *(int *)((long)paVar6->_M_elems + lVar7 * 4 + lVar13);
            if (iVar3 < iVar2) {
              local_38 = *(undefined8 *)(paVar1->_M_elems + 8);
              local_58 = *(undefined8 *)paVar1->_M_elems;
              local_48 = *(undefined8 *)(paVar1->_M_elems + 4);
              uStack_40 = *(undefined8 *)(paVar1->_M_elems + 6);
              uStack_50 = *(undefined8 *)(paVar1->_M_elems + 2);
              if (iVar9._M_current != piVar10) {
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = piVar10;
              }
              iVar9._M_current =
                   (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar9._M_current !=
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00154c92;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (__return_storage_ptr__,iVar9,&local_70);
              goto LAB_00154cdb;
            }
            if (iVar2 < iVar3) goto LAB_00154cdb;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 9);
          iVar9._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,iVar9,&local_70);
          }
          else {
LAB_00154c92:
            *iVar9._M_current = local_70;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
        }
      }
LAB_00154cdb:
      uVar8 = uVar8 + 1;
      paVar6 = (local_68->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x28;
      lVar13 = lVar13 + 0x28;
    } while (uVar8 < (ulong)(((long)(local_68->
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 3)
                            * -0x3333333333333333));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> find_minimum_labelings(std::vector<std::array<int, 10>> &pattern_edge_list,
                                            std::vector<std::array<int, 8>> &starting_edges,
                                            bool ignore_starting_edges)
    {
        std::array<int, 10> min_edge;
        std::vector<int> min_ind; // can contain several indices, if there are several same edges (probably not necessary to have vector, because it may be impossible to have several of them when using edge IDs)
        for (size_t i = 0; i < pattern_edge_list.size(); i++)
        {
            // check if the i-th edge is in the starting_edges list:
            bool is_in_starting = false;

            if (ignore_starting_edges)
            {
                is_in_starting = true;
            }
            else
            {
                for (size_t j = 0; j < starting_edges.size(); j++)
                {
                    bool is_same = true;

                    // use only the first 7 elements (DO NOT USE edge id)
                    for (int k = 0; k < 7; k++)
                    {
                        if (pattern_edge_list[i][k + 2] != starting_edges[j][k])
                        {
                            is_same = false;
                            break;
                        }
                    }
                    if (is_same)
                    {
                        is_in_starting = true;
                        break;
                    }

                }
            }

            // if it is in the starting_edges list, then
            if (is_in_starting)
            {
                // if it is the first edge, add it
                if (min_ind.size() == 0)
                {
                    min_ind.push_back(i);
                    min_edge = pattern_edge_list[i];
                }
                    // if it is not the first one, check if it is smaller
                else
                {
                    // check also whether it is same as the smallest one
                    bool is_same_as_min = true;
                    // // check also edge ID (10th element)
                    // do not check ID
                    for (int k = 2; k < 9; k++)
                    {
                        if (pattern_edge_list[i][k] < min_edge[k])
                        {
                            min_edge = pattern_edge_list[i];
                            min_ind.clear();
                            min_ind.push_back(i);
                            is_same_as_min = false;
                            break;
                        }
                        else if (pattern_edge_list[i][k] > min_edge[k])
                        {
                            is_same_as_min = false;
                            break;
                        }
                    }
                    if (is_same_as_min)
                    {
                        min_ind.push_back(i);
                    }
                }
            }


        }

        return min_ind;

    }